

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_ExtensionIsInitialized_Test::
~ReflectionOpsTest_ExtensionIsInitialized_Test(ReflectionOpsTest_ExtensionIsInitialized_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ReflectionOpsTest, ExtensionIsInitialized) {
  unittest::TestAllExtensions message;

  // Starts out initialized because the foreign message is itself an optional
  // field.
  EXPECT_TRUE(ReflectionOps::IsInitialized(message));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));

  // Once we create that field, the message is no longer initialized.
  message.MutableExtension(unittest::TestRequired::single);
  EXPECT_FALSE(ReflectionOps::IsInitialized(message));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_FALSE(ReflectionOps::IsInitialized(message, false, true));

  // Initialize it.  Now we're initialized.
  message.MutableExtension(unittest::TestRequired::single)->set_a(1);
  message.MutableExtension(unittest::TestRequired::single)->set_b(2);
  message.MutableExtension(unittest::TestRequired::single)->set_c(3);
  EXPECT_TRUE(ReflectionOps::IsInitialized(message));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));

  // Add a repeated version of the message.  No longer initialized.
  message.AddExtension(unittest::TestRequired::multi);
  EXPECT_FALSE(ReflectionOps::IsInitialized(message));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_FALSE(ReflectionOps::IsInitialized(message, false, true));

  // Initialize that repeated version.
  message.MutableExtension(unittest::TestRequired::multi, 0)->set_a(1);
  message.MutableExtension(unittest::TestRequired::multi, 0)->set_b(2);
  message.MutableExtension(unittest::TestRequired::multi, 0)->set_c(3);
  EXPECT_TRUE(ReflectionOps::IsInitialized(message));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));
}